

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O2

void __thiscall blockfilter_tests::blockfilter_basic_test::test_method(blockfilter_basic_test *this)

{
  vector<CTxOut,_std::allocator<CTxOut>_> *pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_02;
  long lVar2;
  CScript scriptPubKeyIn;
  CScript scriptPubKeyIn_00;
  CScript scriptPubKeyIn_01;
  pointer pCVar3;
  bool bVar4;
  uint uVar5;
  CScript *pCVar6;
  const_iterator cVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  BlockFilter *pBVar9;
  uint256 *puVar10;
  iterator pvVar11;
  assertion_result *paVar12;
  long lVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  check_type cVar15;
  uint256 *puVar14;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  char *local_630;
  char *local_628;
  assertion_result local_620;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 local_5a8 [16];
  undefined1 *local_598;
  char **local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  DataStream local_4d8;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  CBlockUndo block_undo;
  CMutableTransaction tx_2;
  CMutableTransaction tx_1;
  BlockFilter default_ctor_block_filter_2;
  BlockFilter default_ctor_block_filter_1;
  BlockFilter block_filter2;
  BlockFilter block_filter;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_228;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_208;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_1e8;
  CBlock block;
  CScript excluded_scripts [4];
  CScript included_scripts [5];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  memset(included_scripts,0,0xa0);
  excluded_scripts[3].super_CScriptBase._union._16_8_ = 0;
  excluded_scripts[3].super_CScriptBase._24_8_ = 0;
  excluded_scripts[3].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  excluded_scripts[3].super_CScriptBase._union._8_8_ = 0;
  excluded_scripts[2].super_CScriptBase._union._16_8_ = 0;
  excluded_scripts[2].super_CScriptBase._24_8_ = 0;
  excluded_scripts[2].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  excluded_scripts[2].super_CScriptBase._union._8_8_ = 0;
  excluded_scripts[1].super_CScriptBase._union._16_8_ = 0;
  excluded_scripts[1].super_CScriptBase._24_8_ = 0;
  excluded_scripts[1].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  excluded_scripts[1].super_CScriptBase._union._8_8_ = 0;
  excluded_scripts[0].super_CScriptBase._union._16_8_ = 0;
  excluded_scripts[0].super_CScriptBase._24_8_ = 0;
  excluded_scripts[0].super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  excluded_scripts[0].super_CScriptBase._union._8_8_ = 0;
  block_filter.m_filter_type = 0x41;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,0,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data.
                               _M_elems._0_4_,block.super_CBlockHeader.nVersion);
  pCVar6 = CScript::operator<<(included_scripts,b);
  CScript::operator<<(pCVar6,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  pCVar6 = CScript::operator<<(included_scripts + 1,OP_DUP);
  pCVar6 = CScript::operator<<(pCVar6,OP_HASH160);
  block_filter.m_filter_type = 0x14;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,1,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b_00._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b_00._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                  m_data._M_elems._0_4_,block.super_CBlockHeader.nVersion);
  pCVar6 = CScript::operator<<(pCVar6,b_00);
  pCVar6 = CScript::operator<<(pCVar6,OP_EQUALVERIFY);
  CScript::operator<<(pCVar6,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  pCVar6 = CScript::operator<<(included_scripts + 2,OP_1);
  block_filter.m_filter_type = 0x21;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,2,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b_01._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b_01._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                  m_data._M_elems._0_4_,block.super_CBlockHeader.nVersion);
  pCVar6 = CScript::operator<<(pCVar6,b_01);
  pCVar6 = CScript::operator<<(pCVar6,OP_1);
  CScript::operator<<(pCVar6,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  pCVar6 = CScript::operator<<((CScript *)&included_scripts[3].super_CScriptBase,OP_0);
  block_filter.m_filter_type = 0x20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,3,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b_02._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b_02._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                  m_data._M_elems._0_4_,block.super_CBlockHeader.nVersion);
  CScript::operator<<(pCVar6,b_02);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  pCVar6 = CScript::operator<<((CScript *)&included_scripts[4].super_CScriptBase,OP_4);
  pCVar6 = CScript::operator<<(pCVar6,OP_ADD);
  pCVar6 = CScript::operator<<(pCVar6,OP_8);
  CScript::operator<<(pCVar6,OP_EQUAL);
  pCVar6 = CScript::operator<<(excluded_scripts,OP_RETURN);
  block_filter.m_filter_type = 0x28;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,4,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b_03._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b_03._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                  m_data._M_elems._0_4_,block.super_CBlockHeader.nVersion);
  CScript::operator<<(pCVar6,b_03);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  block_filter.m_filter_type = 0x21;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&block,5,
             &block_filter.m_filter_type,(allocator_type *)&block_filter2);
  b_04._M_extent._M_extent_value =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ -
       (long)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems.
                      _0_4_,block.super_CBlockHeader.nVersion);
  b_04._M_ptr = (pointer)CONCAT44(block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.
                                  m_data._M_elems._0_4_,block.super_CBlockHeader.nVersion);
  pCVar6 = CScript::operator<<(excluded_scripts + 1,b_04);
  CScript::operator<<(pCVar6,OP_CHECKSIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&block);
  pCVar6 = CScript::operator<<(excluded_scripts + 2,OP_RETURN);
  pCVar6 = CScript::operator<<(pCVar6,OP_4);
  pCVar6 = CScript::operator<<(pCVar6,OP_ADD);
  pCVar6 = CScript::operator<<(pCVar6,OP_8);
  CScript::operator<<(pCVar6,OP_EQUAL);
  CMutableTransaction::CMutableTransaction(&tx_1);
  pvVar1 = &tx_1.vout;
  block.super_CBlockHeader.nVersion = 100;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,included_scripts);
  block.super_CBlockHeader.nVersion = 200;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,included_scripts + 1);
  block.super_CBlockHeader.nVersion = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,excluded_scripts);
  CMutableTransaction::CMutableTransaction(&tx_2);
  pvVar1 = &tx_2.vout;
  block.super_CBlockHeader.nVersion = 300;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,included_scripts + 2);
  block.super_CBlockHeader.nVersion = 0;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,excluded_scripts + 2);
  block.super_CBlockHeader.nVersion = 400;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)pvVar1,(int *)&block,
             (CScript *)&excluded_scripts[3].super_CScriptBase);
  CBlock::CBlock(&block);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&block_filter);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&block.vtx,(shared_ptr<const_CTransaction> *)&block_filter);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7));
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&block_filter);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&block.vtx,(shared_ptr<const_CTransaction> *)&block_filter);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7));
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>(&block_undo.vtxundo);
  pCVar3 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0xf4;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_1e8,&included_scripts[3].super_CScriptBase);
  scriptPubKeyIn.super_CScriptBase._union._4_4_ = in_stack_fffffffffffff9ac;
  scriptPubKeyIn.super_CScriptBase._union._0_4_ = in_stack_fffffffffffff9a8;
  scriptPubKeyIn.super_CScriptBase._union._8_8_ = (undefined8)_cVar15;
  scriptPubKeyIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff9b8;
  scriptPubKeyIn.super_CScriptBase._24_8_ = in_stack_fffffffffffff9c0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn);
  default_ctor_block_filter_1.m_filter_type = 0xe8;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x03';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = 1;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar3 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_1e8);
  pCVar3 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0x58;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_208,&included_scripts[4].super_CScriptBase);
  scriptPubKeyIn_00.super_CScriptBase._union._4_4_ = in_stack_fffffffffffff9ac;
  scriptPubKeyIn_00.super_CScriptBase._union._0_4_ = in_stack_fffffffffffff9a8;
  scriptPubKeyIn_00.super_CScriptBase._union._8_8_ = (undefined8)_cVar15;
  scriptPubKeyIn_00.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff9b8;
  scriptPubKeyIn_00.super_CScriptBase._24_8_ = in_stack_fffffffffffff9c0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn_00);
  default_ctor_block_filter_1.m_filter_type = 0x10;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\'';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = BASIC;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar3 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_208);
  pCVar3 = block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  block_filter2.m_filter_type = 0xbc;
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_228,&excluded_scripts[3].super_CScriptBase);
  scriptPubKeyIn_01.super_CScriptBase._union._4_4_ = in_stack_fffffffffffff9ac;
  scriptPubKeyIn_01.super_CScriptBase._union._0_4_ = in_stack_fffffffffffff9a8;
  scriptPubKeyIn_01.super_CScriptBase._union._8_8_ = (undefined8)_cVar15;
  scriptPubKeyIn_01.super_CScriptBase._union._16_8_ = in_stack_fffffffffffff9b8;
  scriptPubKeyIn_01.super_CScriptBase._24_8_ = in_stack_fffffffffffff9c0;
  CTxOut::CTxOut((CTxOut *)&block_filter,(CAmount *)&block_filter2,scriptPubKeyIn_01);
  default_ctor_block_filter_1.m_filter_type = 0xa0;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0] = 0x86;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\x01';
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  default_ctor_block_filter_2.m_filter_type = BASIC;
  std::vector<Coin,std::allocator<Coin>>::emplace_back<CTxOut,int,bool>
            ((vector<Coin,std::allocator<Coin>> *)(pCVar3 + -1),(CTxOut *)&block_filter,
             (int *)&default_ctor_block_filter_1,(bool *)&default_ctor_block_filter_2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (block_filter.m_block_hash.super_base_blob<256U>.m_data._M_elems + 7));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_228);
  BlockFilter::BlockFilter(&block_filter,BASIC,&block,&block_undo);
  for (lVar13 = 0; lVar13 != 0xa0; lVar13 = lVar13 + 0x20) {
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_460 = "";
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x6a;
    file.m_begin = (iterator)&local_468;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_478,msg);
    uVar5 = *(uint *)((long)&included_scripts[0].super_CScriptBase._size + lVar13);
    if (uVar5 < 0x1d) {
      cVar7.ptr = (uchar *)((long)&included_scripts[0].super_CScriptBase._union + lVar13);
    }
    else {
      cVar7.ptr = *(uchar **)((long)&included_scripts[0].super_CScriptBase._union + lVar13);
      uVar5 = uVar5 - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&default_ctor_block_filter_2,
               cVar7,(const_iterator)(cVar7.ptr + (int)uVar5),(allocator_type *)local_5a8);
    bVar4 = GCSFilter::Match(&block_filter.m_filter,(Element *)&default_ctor_block_filter_2);
    default_ctor_block_filter_1.m_filter_type = bVar4;
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xb6039a;
    local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb603d8;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter2._0_8_ = &PTR__lazy_ostream_0113a070;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
         boost::unit_test::lazy_ostream::inst;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &local_4d8;
    local_488 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_480 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&default_ctor_block_filter_1,(lazy_ostream *)&block_filter2,1,0,
               WARN,_cVar15,(size_t)&local_488,0x6a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf
               ));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &default_ctor_block_filter_2);
  }
  for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 0x20) {
    local_498 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_490 = "";
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    file_00.m_end = (iterator)0x6d;
    file_00.m_begin = (iterator)&local_498;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4a8,
               msg_00);
    uVar5 = *(uint *)((long)&excluded_scripts[0].super_CScriptBase._size + lVar13);
    if (uVar5 < 0x1d) {
      cVar7.ptr = (uchar *)((long)&excluded_scripts[0].super_CScriptBase._union + lVar13);
    }
    else {
      cVar7.ptr = *(uchar **)((long)&excluded_scripts[0].super_CScriptBase._union + lVar13);
      uVar5 = uVar5 - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&default_ctor_block_filter_2,
               cVar7,(const_iterator)(cVar7.ptr + (int)uVar5),(allocator_type *)local_5a8);
    bVar4 = GCSFilter::Match(&block_filter.m_filter,(Element *)&default_ctor_block_filter_2);
    default_ctor_block_filter_1.m_filter_type = !bVar4;
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xb60399;
    local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb603d8;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    block_filter2._0_8_ = &PTR__lazy_ostream_0113a070;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
         boost::unit_test::lazy_ostream::inst;
    block_filter2.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = &local_4d8;
    local_4b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_4b0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&default_ctor_block_filter_1,(lazy_ostream *)&block_filter2,1,0,
               WARN,_cVar15,(size_t)&local_4b8,0x6d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf
               ));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &default_ctor_block_filter_2);
  }
  BlockFilter::BlockFilter(&block_filter2);
  local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8.m_read_pos = 0;
  local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BlockFilter::Serialize<DataStream>(&block_filter,&local_4d8);
  BlockFilter::Unserialize<DataStream>(&block_filter2,&local_4d8);
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x77;
  file_01.m_begin = (iterator)&local_4e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4f8,
             msg_01);
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
       default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
       0xffffffffffffff00;
  default_ctor_block_filter_1._0_8_ = &PTR__lazy_ostream_01139f30;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
       boost::unit_test::lazy_ostream::inst;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_500 = "";
  pBVar9 = &default_ctor_block_filter_2;
  default_ctor_block_filter_2.m_filter_type = block_filter.m_filter_type;
  local_5a8[0] = block_filter2.m_filter_type;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
            (&default_ctor_block_filter_1,&local_508,0x77,1,2,pBVar9,0xb603d9,local_5a8,
             "block_filter2.GetFilterType()");
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pBVar9;
  msg_02.m_begin = pvVar8;
  file_02.m_end = (iterator)0x78;
  file_02.m_begin = (iterator)&local_518;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_528,
             msg_02);
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
       default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
       0xffffffffffffff00;
  default_ctor_block_filter_1._0_8_ = &PTR__lazy_ostream_01139f30;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
       boost::unit_test::lazy_ostream::inst;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_530 = "";
  puVar10 = &block_filter.m_block_hash;
  puVar14 = &block_filter2.m_block_hash;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&default_ctor_block_filter_1,&local_538,0x78,1,2,puVar10,0xb60414,puVar14,
             "block_filter2.GetBlockHash()");
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)puVar10;
  msg_03.m_begin = pvVar8;
  file_03.m_end = (iterator)0x79;
  file_03.m_begin = (iterator)&local_548;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_558,
             msg_03);
  this_00 = &block_filter2.m_filter.m_encoded;
  default_ctor_block_filter_2.m_filter_type =
       std::operator==(&block_filter.m_filter.m_encoded,this_00);
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_5a8._0_8_ = "block_filter.GetEncodedFilter() == block_filter2.GetEncodedFilter()";
  local_5a8._8_8_ = "";
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ =
       default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._7_8_ &
       0xffffffffffffff00;
  default_ctor_block_filter_1._0_8_ = &PTR__lazy_ostream_0113a070;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._15_8_ =
       boost::unit_test::lazy_ostream::inst;
  default_ctor_block_filter_1.m_block_hash.super_base_blob<256U>.m_data._M_elems._23_8_ = local_5a8;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_560 = "";
  pvVar8 = &DAT_00000001;
  pvVar11 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&default_ctor_block_filter_2,
             (lazy_ostream *)&default_ctor_block_filter_1,1,0,WARN,(check_type)puVar14,
             (size_t)&local_568,0x79);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (default_ctor_block_filter_2.m_block_hash.super_base_blob<256U>.m_data._M_elems + 0xf))
  ;
  BlockFilter::BlockFilter(&default_ctor_block_filter_1);
  BlockFilter::BlockFilter(&default_ctor_block_filter_2);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar11;
  msg_04.m_begin = pvVar8;
  file_04.m_end = (iterator)0x7d;
  file_04.m_begin = (iterator)&local_578;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_588,
             msg_04);
  local_5a8._8_8_ = local_5a8._8_8_ & 0xffffffffffffff00;
  local_5a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_598 = boost::unit_test::lazy_ostream::inst;
  local_590 = (char **)0xc694e1;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5b0 = "";
  paVar12 = &local_620;
  local_620.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)default_ctor_block_filter_1.m_filter_type;
  local_630 = (char *)CONCAT71(local_630._1_7_,default_ctor_block_filter_2.m_filter_type);
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,BlockFilterType,BlockFilterType>
            (local_5a8,&local_5b8,0x7d,1,2,paVar12,0xb60491,&local_630,
             "default_ctor_block_filter_2.GetFilterType()");
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)paVar12;
  msg_05.m_begin = pvVar8;
  file_05.m_end = (iterator)0x7e;
  file_05.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5d8,
             msg_05);
  local_5a8._8_8_ = local_5a8._8_8_ & 0xffffffffffffff00;
  local_5a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_598 = boost::unit_test::lazy_ostream::inst;
  local_590 = (char **)0xc694e1;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5e0 = "";
  puVar10 = &default_ctor_block_filter_1.m_block_hash;
  puVar14 = &default_ctor_block_filter_2.m_block_hash;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (local_5a8,&local_5e8,0x7e,1,2,puVar10,0xb604e9,puVar14,
             "default_ctor_block_filter_2.GetBlockHash()");
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)puVar10;
  msg_06.m_begin = pvVar8;
  file_06.m_end = (iterator)0x7f;
  file_06.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_608,
             msg_06);
  this_01 = &default_ctor_block_filter_1.m_filter.m_encoded;
  this_02 = &default_ctor_block_filter_2.m_filter.m_encoded;
  local_620.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::operator==(this_01,this_02);
  local_620.m_message.px = (element_type *)0x0;
  local_620.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_630 = 
  "default_ctor_block_filter_1.GetEncodedFilter() == default_ctor_block_filter_2.GetEncodedFilter()"
  ;
  local_628 = "";
  local_5a8._8_8_ = local_5a8._8_8_ & 0xffffffffffffff00;
  local_5a8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_598 = boost::unit_test::lazy_ostream::inst;
  local_590 = &local_630;
  boost::test_tools::tt_detail::report_assertion
            (&local_620,(lazy_ostream *)local_5a8,1,0,WARN,(check_type)puVar14,
             (size_t)&stack0xfffffffffffff9c0,0x7f);
  boost::detail::shared_count::~shared_count(&local_620.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&this_02->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_4d8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&block_filter.m_filter.m_encoded.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  CMutableTransaction::~CMutableTransaction(&tx_2);
  CMutableTransaction::~CMutableTransaction(&tx_1);
  lVar13 = 0x60;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&excluded_scripts[0].super_CScriptBase._union + lVar13));
    lVar13 = lVar13 + -0x20;
  } while (lVar13 != -0x20);
  lVar13 = 0x80;
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               ((long)&included_scripts[0].super_CScriptBase._union + lVar13));
    lVar13 = lVar13 + -0x20;
  } while (lVar13 != -0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_basic_test)
{
    CScript included_scripts[5], excluded_scripts[4];

    // First two are outputs on a single transaction.
    included_scripts[0] << std::vector<unsigned char>(0, 65) << OP_CHECKSIG;
    included_scripts[1] << OP_DUP << OP_HASH160 << std::vector<unsigned char>(1, 20) << OP_EQUALVERIFY << OP_CHECKSIG;

    // Third is an output on in a second transaction.
    included_scripts[2] << OP_1 << std::vector<unsigned char>(2, 33) << OP_1 << OP_CHECKMULTISIG;

    // Last two are spent by a single transaction.
    included_scripts[3] << OP_0 << std::vector<unsigned char>(3, 32);
    included_scripts[4] << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    // OP_RETURN output is an output on the second transaction.
    excluded_scripts[0] << OP_RETURN << std::vector<unsigned char>(4, 40);

    // This script is not related to the block at all.
    excluded_scripts[1] << std::vector<unsigned char>(5, 33) << OP_CHECKSIG;

    // OP_RETURN is non-standard since it's not followed by a data push, but is still excluded from
    // filter.
    excluded_scripts[2] << OP_RETURN << OP_4 << OP_ADD << OP_8 << OP_EQUAL;

    CMutableTransaction tx_1;
    tx_1.vout.emplace_back(100, included_scripts[0]);
    tx_1.vout.emplace_back(200, included_scripts[1]);
    tx_1.vout.emplace_back(0, excluded_scripts[0]);

    CMutableTransaction tx_2;
    tx_2.vout.emplace_back(300, included_scripts[2]);
    tx_2.vout.emplace_back(0, excluded_scripts[2]);
    tx_2.vout.emplace_back(400, excluded_scripts[3]); // Script is empty

    CBlock block;
    block.vtx.push_back(MakeTransactionRef(tx_1));
    block.vtx.push_back(MakeTransactionRef(tx_2));

    CBlockUndo block_undo;
    block_undo.vtxundo.emplace_back();
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(500, included_scripts[3]), 1000, true);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(600, included_scripts[4]), 10000, false);
    block_undo.vtxundo.back().vprevout.emplace_back(CTxOut(700, excluded_scripts[3]), 100000, false);

    BlockFilter block_filter(BlockFilterType::BASIC, block, block_undo);
    const GCSFilter& filter = block_filter.GetFilter();

    for (const CScript& script : included_scripts) {
        BOOST_CHECK(filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }
    for (const CScript& script : excluded_scripts) {
        BOOST_CHECK(!filter.Match(GCSFilter::Element(script.begin(), script.end())));
    }

    // Test serialization/unserialization.
    BlockFilter block_filter2;

    DataStream stream{};
    stream << block_filter;
    stream >> block_filter2;

    BOOST_CHECK_EQUAL(block_filter.GetFilterType(), block_filter2.GetFilterType());
    BOOST_CHECK_EQUAL(block_filter.GetBlockHash(), block_filter2.GetBlockHash());
    BOOST_CHECK(block_filter.GetEncodedFilter() == block_filter2.GetEncodedFilter());

    BlockFilter default_ctor_block_filter_1;
    BlockFilter default_ctor_block_filter_2;
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetFilterType(), default_ctor_block_filter_2.GetFilterType());
    BOOST_CHECK_EQUAL(default_ctor_block_filter_1.GetBlockHash(), default_ctor_block_filter_2.GetBlockHash());
    BOOST_CHECK(default_ctor_block_filter_1.GetEncodedFilter() == default_ctor_block_filter_2.GetEncodedFilter());
}